

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

Var Js::JavascriptArray::SomeHelper<unsigned_int>
              (JavascriptArray *pArr,TypedArrayBase *typedArrayBase,RecyclableObject *obj,
              uint length,Arguments *args,ScriptContext *scriptContext)

{
  code *pcVar1;
  Var pvVar2;
  Var pvVar3;
  Var pvVar4;
  bool bVar5;
  int iVar6;
  BOOL BVar7;
  ThreadContext *pTVar8;
  Var pvVar9;
  undefined4 *puVar10;
  uint *puVar11;
  undefined4 extraout_var;
  JavascriptMethod p_Var12;
  Var pvVar13;
  JavascriptLibrary *pJVar14;
  CallInfo local_c8;
  CallInfo local_c0;
  undefined1 local_b8 [8];
  AutoReentrancyHandler autoReentrancyHandler;
  uint32 local_a0;
  uint32 k;
  Var pvStack_98;
  uint32 end;
  Var testResult;
  Var element;
  Var thisArg;
  RecyclableObject *callBackFn;
  undefined1 local_68 [8];
  JsReentLock jsReentLock;
  ScriptContext *scriptContext_local;
  Arguments *args_local;
  RecyclableObject *pRStack_30;
  uint length_local;
  RecyclableObject *obj_local;
  TypedArrayBase *typedArrayBase_local;
  JavascriptArray *pArr_local;
  
  jsReentLock._24_8_ = scriptContext;
  args_local._4_4_ = length;
  pRStack_30 = obj;
  obj_local = (RecyclableObject *)typedArrayBase;
  typedArrayBase_local = (TypedArrayBase *)pArr;
  pTVar8 = ScriptContext::GetThreadContext(scriptContext);
  JsReentLock::JsReentLock((JsReentLock *)local_68,pTVar8);
  JsReentLock::setObjectForMutation((JsReentLock *)local_68,typedArrayBase_local);
  if (1 < (SUB84(args->Info,0) & 0xffffff)) {
    pvVar9 = Arguments::operator[](args,1);
    bVar5 = JavascriptConversion::IsCallable(pvVar9);
    if (bVar5) {
      pvVar9 = Arguments::operator[](args,1);
      thisArg = VarTo<Js::RecyclableObject>(pvVar9);
      element = (Var)0x0;
      if ((SUB84(args->Info,0) & 0xffffff) < 3) {
        pJVar14 = ScriptContext::GetLibrary((ScriptContext *)jsReentLock._24_8_);
        element = JavascriptLibraryBase::GetUndefined(&pJVar14->super_JavascriptLibraryBase);
      }
      else {
        element = Arguments::operator[](args,2);
      }
      if (((obj_local == (RecyclableObject *)0x0) && (typedArrayBase_local == (TypedArrayBase *)0x0)
          ) && (bVar5 = VarIs<Js::TypedArrayBase,Js::RecyclableObject>(pRStack_30), bVar5)) {
        obj_local = (RecyclableObject *)
                    UnsafeVarTo<Js::TypedArrayBase,Js::RecyclableObject>(pRStack_30);
      }
      testResult = (Var)0x0;
      pvStack_98 = (Var)0x0;
      if (obj_local == (RecyclableObject *)0x0) {
        JsReentLock::unlock((JsReentLock *)local_68);
        pArr_local = (JavascriptArray *)
                     SomeObjectHelper<unsigned_int>
                               (pRStack_30,args_local._4_4_,0,(RecyclableObject *)thisArg,element,
                                (ScriptContext *)jsReentLock._24_8_);
      }
      else {
        bVar5 = VarIsCorrectType<Js::TypedArrayBase>((TypedArrayBase *)obj_local);
        if (!bVar5) {
          bVar5 = VarIsCorrectType<Js::TypedArrayBase>((TypedArrayBase *)obj_local);
          if (!bVar5) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar10 = 1;
            bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                        ,0x238b,"(VarIsCorrectType(typedArrayBase))",
                                        "VarIsCorrectType(typedArrayBase)");
            if (!bVar5) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar10 = 0;
          }
          Throw::FatalInternalError(-0x7fffbffb);
        }
        local_a0 = ArrayObject::GetLength((ArrayObject *)obj_local);
        puVar11 = min<unsigned_int>((uint *)((long)&args_local + 4),&local_a0);
        k = *puVar11;
        for (autoReentrancyHandler._12_4_ = 0; (uint)autoReentrancyHandler._12_4_ < k;
            autoReentrancyHandler._12_4_ = autoReentrancyHandler._12_4_ + 1) {
          iVar6 = (*(obj_local->super_FinalizableObject).super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[0x72])
                            (obj_local,(ulong)(uint)autoReentrancyHandler._12_4_);
          testResult = (Var)CONCAT44(extraout_var,iVar6);
          JsReentLock::unlock((JsReentLock *)local_68);
          pTVar8 = ScriptContext::GetThreadContext((ScriptContext *)jsReentLock._24_8_);
          AutoReentrancyHandler::AutoReentrancyHandler((AutoReentrancyHandler *)local_b8,pTVar8);
          pTVar8 = ScriptContext::GetThreadContext((ScriptContext *)jsReentLock._24_8_);
          ThreadContext::CheckAndResetReentrancySafeOrHandled(pTVar8);
          pTVar8 = ScriptContext::GetThreadContext((ScriptContext *)jsReentLock._24_8_);
          ThreadContext::AssertJsReentrancy(pTVar8);
          pvVar9 = thisArg;
          p_Var12 = RecyclableObject::GetEntryPoint((RecyclableObject *)thisArg);
          CheckIsExecutable((RecyclableObject *)pvVar9,p_Var12);
          p_Var12 = RecyclableObject::GetEntryPoint((RecyclableObject *)thisArg);
          pvVar3 = thisArg;
          CallInfo::CallInfo(&local_c0,CallFlags_Value,4);
          pvVar4 = thisArg;
          CallInfo::CallInfo(&local_c8,CallFlags_Value,4);
          pvVar2 = element;
          pvVar9 = testResult;
          pvVar13 = JavascriptNumber::ToVar
                              (autoReentrancyHandler._12_4_,(ScriptContext *)jsReentLock._24_8_);
          pvStack_98 = (*p_Var12)((RecyclableObject *)pvVar3,(CallInfo)pvVar4,local_c0,0,0,0,0,
                                  local_c8,pvVar2,pvVar9,pvVar13,obj_local);
          AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)local_b8);
          BVar7 = JavascriptConversion::ToBoolean(pvStack_98,(ScriptContext *)jsReentLock._24_8_);
          if (BVar7 != 0) {
            pJVar14 = ScriptContext::GetLibrary((ScriptContext *)jsReentLock._24_8_);
            pArr_local = (JavascriptArray *)
                         JavascriptLibraryBase::GetTrue(&pJVar14->super_JavascriptLibraryBase);
            goto LAB_011014c0;
          }
        }
        pJVar14 = ScriptContext::GetLibrary((ScriptContext *)jsReentLock._24_8_);
        pArr_local = (JavascriptArray *)
                     JavascriptLibraryBase::GetFalse(&pJVar14->super_JavascriptLibraryBase);
      }
LAB_011014c0:
      JsReentLock::~JsReentLock((JsReentLock *)local_68);
      return pArr_local;
    }
  }
  if (obj_local == (RecyclableObject *)0x0) {
    JavascriptError::ThrowTypeError
              ((ScriptContext *)jsReentLock._24_8_,-0x7ff5ec34,L"Array.prototype.some");
  }
  JavascriptError::ThrowTypeError
            ((ScriptContext *)jsReentLock._24_8_,-0x7ff5ec34,L"[TypedArray].prototype.some");
}

Assistant:

Var JavascriptArray::SomeHelper(JavascriptArray* pArr, Js::TypedArrayBase* typedArrayBase, RecyclableObject* obj, T length, Arguments& args, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, pArr);

        if (args.Info.Count < 2 || !JavascriptConversion::IsCallable(args[1]))
        {
            // We are in the TypedArray version of this API if and only if typedArrayBase != nullptr
            if (typedArrayBase != nullptr)
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("[TypedArray].prototype.some"));
            }
            else
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("Array.prototype.some"));
            }
        }

        RecyclableObject* callBackFn = VarTo<RecyclableObject>(args[1]);
        Var thisArg = nullptr;

        if (args.Info.Count > 2)
        {
            thisArg = args[2];
        }
        else
        {
            thisArg = scriptContext->GetLibrary()->GetUndefined();
        }

        // If we came from Array.prototype.some and source object is not a JavascriptArray, source could be a TypedArray
        if (typedArrayBase == nullptr && pArr == nullptr && VarIs<TypedArrayBase>(obj))
        {
            typedArrayBase = UnsafeVarTo<TypedArrayBase>(obj);
        }

        Var element = nullptr;
        Var testResult = nullptr;

        if (typedArrayBase)
        {
            AssertAndFailFast(VarIsCorrectType(typedArrayBase));
            uint32 end = (uint32)min(length, (T)typedArrayBase->GetLength());

            for (uint32 k = 0; k < end; k++)
            {
                // No need to do HasItem, as it cannot be observable unless 'typedArrayBase' is proxy. And we have established that it is indeed typedarray.

                element = typedArrayBase->DirectGetItem(k);

                JS_REENTRANT_UNLOCK(jsReentLock,
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        testResult = CALL_FUNCTION(scriptContext->GetThreadContext(), callBackFn, CallInfo(CallFlags_Value, 4), thisArg,
                                element,
                                JavascriptNumber::ToVar(k, scriptContext),
                                typedArrayBase);
                    }
                    END_SAFE_REENTRANT_CALL
                );

                if (JavascriptConversion::ToBoolean(testResult, scriptContext))
                {
                    return scriptContext->GetLibrary()->GetTrue();
                }
            }
        }
        else
        {
            JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::SomeObjectHelper<T>(obj, length, 0u, callBackFn, thisArg, scriptContext));
        }

        return scriptContext->GetLibrary()->GetFalse();
    }